

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O1

void Int_ManPrepareInter(Int_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Sto_Cls_t *pSVar3;
  uint *puVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  if (8 < p->nVarsAB) {
    __assert_fail("p->nVarsAB <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                  ,0x3c3,"void Int_ManPrepareInter(Int_Man_t *)");
  }
  for (pSVar3 = p->pCnf->pHead;
      (pSVar3 != (Sto_Cls_t *)0x0 && ((*(uint *)&pSVar3->field_0x1c & 2) != 0));
      pSVar3 = pSVar3->pNext) {
    if ((*(uint *)&pSVar3->field_0x1c & 1) == 0) {
      lVar7 = (long)p->nWords;
      if (0 < lVar7) {
        memset(p->pInters + pSVar3->Id * lVar7,0xff,lVar7 << 2);
      }
    }
    else {
      puVar4 = p->pInters;
      lVar7 = (long)p->nWords;
      if (0 < lVar7) {
        memset(puVar4 + pSVar3->Id * lVar7,0,lVar7 << 2);
      }
      if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff8) != 0) {
        piVar5 = p->pVarTypes;
        uVar6 = 0;
        do {
          uVar1 = *(uint *)((long)&pSVar3[1].pNext + uVar6 * 4);
          if (piVar5[(int)uVar1 >> 1] < 0) {
            uVar9 = ~piVar5[(int)uVar1 >> 1];
            if (p->nVarsAB <= (int)uVar9) {
              __assert_fail("VarAB >= 0 && VarAB < p->nVarsAB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInter.c"
                            ,0x3d6,"void Int_ManPrepareInter(Int_Man_t *)");
            }
            uVar2 = p->nWords;
            iVar10 = pSVar3->Id * uVar2;
            lVar7 = (ulong)uVar9 * 0x20;
            if ((uVar1 & 1) == 0) {
              if (0 < (int)uVar2) {
                lVar8 = (ulong)uVar2 + 1;
                do {
                  puVar4[(long)iVar10 + lVar8 + -2] =
                       puVar4[(long)iVar10 + lVar8 + -2] |
                       *(uint *)(&UNK_009f3878 + lVar8 * 4 + lVar7);
                  lVar8 = lVar8 + -1;
                } while (1 < lVar8);
              }
            }
            else if (0 < (int)uVar2) {
              lVar8 = (ulong)uVar2 + 1;
              do {
                puVar4[(long)iVar10 + lVar8 + -2] =
                     puVar4[(long)iVar10 + lVar8 + -2] |
                     ~*(uint *)(&UNK_009f3878 + lVar8 * 4 + lVar7);
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff));
      }
    }
  }
  return;
}

Assistant:

void Int_ManPrepareInter( Int_Man_t * p )
{
    // elementary truth tables
    unsigned uTruths[8][8] = {
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    assert( p->nVarsAB <= 8 );

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Int_ManTruthFill( Int_ManTruthRead(p, pClause), p->nWords );
//            Int_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Int_ManTruthClear( Int_ManTruthRead(p, pClause), p->nWords );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < p->nVarsAB );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Int_ManTruthOrNot( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
                else
                    Int_ManTruthOr( Int_ManTruthRead(p, pClause), uTruths[VarAB], p->nWords );
            }
        }
//        Int_ManPrintInterOne( p, pClause );
    }
}